

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

bool __thiscall
duckdb_snappy::SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>::SlowAppendFromSelf
          (SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> *this,size_t offset,size_t len)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  bool bVar6;
  char c;
  char local_29;
  
  pcVar2 = this->op_ptr_;
  pcVar4 = pcVar2 + (this->full_size_ - (long)this->op_base_);
  if (((char *)(offset - 1) < pcVar4) && (len <= this->expected_ - (long)pcVar4)) {
    uVar5 = (long)pcVar4 - offset;
    lVar3 = len + 1;
    while( true ) {
      lVar3 = lVar3 + -1;
      bVar6 = lVar3 == 0;
      if (bVar6) break;
      local_29 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5 >> 0x10][uVar5 & 0xffff];
      if (this->op_limit_ == pcVar2) {
        this->op_ptr_ = pcVar2;
        bVar1 = SlowAppend(this,&local_29,1);
        pcVar2 = this->op_ptr_;
      }
      else {
        *pcVar2 = local_29;
        pcVar2 = pcVar2 + 1;
        bVar1 = true;
      }
      if (bVar1 == false) {
        this->op_ptr_ = pcVar2;
        return bVar6;
      }
      uVar5 = uVar5 + 1;
    }
    this->op_ptr_ = pcVar2;
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

inline size_t Size() const { return full_size_ + (op_ptr_ - op_base_); }